

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.h
# Opt level: O1

void * __thiscall tinyxml2::MemPoolT<104>::Alloc(MemPoolT<104> *this)

{
  int iVar1;
  int iVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  Chunk *pCVar5;
  long lVar6;
  long lVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  undefined1 in_ZMM3 [64];
  undefined1 auVar11 [16];
  undefined1 in_ZMM4 [64];
  undefined1 auVar12 [32];
  undefined1 auVar13 [16];
  
  auVar11 = in_ZMM4._0_16_;
  auVar10 = in_ZMM3._0_32_;
  if (this->_root == (Chunk *)0x0) {
    pCVar5 = (Chunk *)operator_new(0xfd8);
    lVar7 = 0;
    memset(pCVar5,0,0xfd8);
    DynArray<tinyxml2::MemPoolT<104>::Block_*,_10>::EnsureCapacity
              (&this->_blockPtrs,(this->_blockPtrs)._size + 1);
    iVar1 = (this->_blockPtrs)._size;
    (this->_blockPtrs)._size = iVar1 + 1;
    (this->_blockPtrs)._mem[iVar1] = (Block *)pCVar5;
    auVar3 = vpmovsxbq_avx2(ZEXT416(0x3020100));
    auVar8._8_8_ = 0x8000000000000000;
    auVar8._0_8_ = 0x8000000000000000;
    auVar9._8_8_ = 0x8000000000000025;
    auVar9._0_8_ = 0x8000000000000025;
    auVar10 = vpcmpeqd_avx2(auVar10,auVar10);
    auVar11 = vpcmpeqd_avx(auVar11,auVar11);
    auVar12._8_8_ = 4;
    auVar12._0_8_ = 4;
    auVar12._16_8_ = 4;
    auVar12._24_8_ = 4;
    do {
      auVar13 = vpcmpgtq_avx(auVar3._0_16_ ^ auVar8,auVar9);
      auVar4 = vpsubq_avx2(auVar3,auVar10);
      if ((~auVar13._0_4_ & 1) != 0) {
        *(Chunk **)((long)pCVar5 + lVar7) = pCVar5 + auVar4._0_8_;
      }
      auVar13 = vpcmpgtq_avx(auVar3._0_16_ ^ auVar8,auVar9);
      auVar13 = vpshufd_avx(auVar13,0xaa);
      if (((auVar13 ^ auVar11) >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        lVar6 = vpextrq_avx(auVar4._0_16_,1);
        *(Chunk **)((long)pCVar5 + lVar7 + 0x68) = pCVar5 + lVar6;
      }
      auVar13._8_8_ = auVar3._16_8_;
      auVar13._0_8_ = auVar3._16_8_;
      auVar13 = vpcmpgtq_avx(auVar13 ^ auVar8,auVar9);
      if (((auVar13 ^ auVar11) & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *(Chunk **)((long)pCVar5 + lVar7 + 0xd0) = pCVar5 + auVar4._16_8_;
      }
      auVar13 = vpcmpgtq_avx(auVar3._16_16_ ^ auVar8,auVar9);
      auVar13 = vpshufd_avx(auVar13,0xaa);
      if (((auVar13 ^ auVar11) >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        lVar6 = vpextrq_avx(auVar4._16_16_,1);
        *(Chunk **)((long)pCVar5 + lVar7 + 0x138) = pCVar5 + lVar6;
      }
      auVar3 = vpaddq_avx2(auVar3,auVar12);
      lVar7 = lVar7 + 0x1a0;
    } while (lVar7 != 0x1040);
    pCVar5[0x26].next = (Chunk *)0x0;
    this->_root = pCVar5;
  }
  pCVar5 = this->_root;
  this->_root = pCVar5->next;
  iVar2 = this->_currentAllocs;
  iVar1 = iVar2 + 1;
  this->_currentAllocs = iVar1;
  if (this->_maxAllocs <= iVar2) {
    this->_maxAllocs = iVar1;
  }
  this->_nAllocs = this->_nAllocs + 1;
  this->_nUntracked = this->_nUntracked + 1;
  return pCVar5;
}

Assistant:

virtual void* Alloc() {
        if ( !_root ) {
            // Need a new block.
            Block* block = new Block();
            _blockPtrs.Push( block );

            for( int i=0; i<COUNT-1; ++i ) {
                block->chunk[i].next = &block->chunk[i+1];
            }
            block->chunk[COUNT-1].next = 0;
            _root = block->chunk;
        }
        void* result = _root;
        _root = _root->next;

        ++_currentAllocs;
        if ( _currentAllocs > _maxAllocs ) {
            _maxAllocs = _currentAllocs;
        }
        _nAllocs++;
        _nUntracked++;
        return result;
    }